

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_format.cc
# Opt level: O0

string * detect_format(ifstream *infile,string *filename)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  istream *piVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 uVar7;
  string *in_RDX;
  istream *in_RSI;
  string *in_RDI;
  uint items_if_labelledlad;
  uint items_if_lad;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  stringstream line_stream;
  smatch match;
  string line;
  size_t *in_stack_fffffffffffff998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b0;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  allocator<char> *__a;
  char *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined1 uVar8;
  string *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffff9f8;
  string *filename_00;
  GraphFileError *in_stack_fffffffffffffa00;
  allocator<char> local_473;
  undefined1 local_472;
  allocator<char> local_471 [40];
  undefined1 local_449;
  undefined1 local_322;
  string local_321;
  allocator<char> local_2fe;
  allocator<char> local_2fd;
  int local_2fc;
  int local_2f8;
  undefined1 local_2f2;
  string local_2d0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  stringstream local_298 [396];
  allocator<char> local_10c;
  allocator<char> local_10b;
  undefined1 local_10a;
  allocator<char> local_e2;
  allocator<char> local_e1;
  undefined4 local_e0;
  allocator<char> local_db;
  undefined1 local_da;
  undefined1 local_b2;
  undefined1 local_6a;
  string local_38 [32];
  string *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_stack_fffffffffffff9b0);
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38);
  bVar1 = std::ios::operator!(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
  uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
  if ((bVar1 & 1) == 0) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d13d0
                      );
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
    if (!bVar2) {
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::dimacs_comment_abi_cxx11_ ==
           '\0') &&
         (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                       dimacs_comment_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      dimacs_comment_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             dimacs_comment_abi_cxx11_);
      }
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::dimacs_problem_abi_cxx11_ ==
           '\0') &&
         (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                       dimacs_problem_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      dimacs_problem_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             dimacs_problem_abi_cxx11_);
      }
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_ == '\0')
         && (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)
                                          ::lad_header_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      lad_header_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             lad_header_abi_cxx11_);
      }
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::
           lad_zero_labelled_line_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                       lad_zero_labelled_line_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      lad_zero_labelled_line_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             lad_zero_labelled_line_abi_cxx11_);
      }
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::
           lad_zero_unlabelled_line_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                       lad_zero_unlabelled_line_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      lad_zero_unlabelled_line_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             lad_zero_unlabelled_line_abi_cxx11_);
      }
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_ == '\0')
         && (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)
                                          ::lad_line_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_
                     ,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             lad_line_abi_cxx11_);
      }
      if ((detect_format(std::ifstream&,std::__cxx11::string_const&)::csv_problem_abi_cxx11_ == '\0'
          ) && (iVar3 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)
                                             ::csv_problem_abi_cxx11_), iVar3 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff9e0
                   ,in_stack_fffffffffffff9d8,(flag_type)((ulong)in_stack_fffffffffffff9d0 >> 0x20))
        ;
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      csv_problem_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                             csv_problem_abi_cxx11_);
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffff9a0);
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (in_stack_fffffffffffff9c0,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffff9b0,
                         (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      if (bVar2) {
        do {
          bVar2 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (in_stack_fffffffffffff9c0,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             in_stack_fffffffffffff9b0,
                             (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
          if (!bVar2) {
            bVar2 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              (in_stack_fffffffffffff9c0,
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               in_stack_fffffffffffff9b0,
                               (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
            if (!bVar2) {
              local_da = 1;
              uVar7 = __cxa_allocate_exception(0x30);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                         (allocator<char> *)in_stack_fffffffffffff9d0);
              GraphFileError::GraphFileError
                        (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                         in_stack_fffffffffffff9f0,(bool)uVar8);
              local_da = 0;
              __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                       (allocator<char> *)in_stack_fffffffffffff9d0);
            std::allocator<char>::~allocator(&local_db);
            local_e0 = 1;
            goto LAB_001d2b74;
          }
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_38)
          ;
          bVar1 = std::ios::operator!(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
          if ((bVar1 & 1) != 0) break;
          bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1d1849);
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
        } while (!bVar2);
        local_b2 = 1;
        uVar7 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                   (allocator<char> *)in_stack_fffffffffffff9d0);
        GraphFileError::GraphFileError
                  (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
                   (bool)uVar8);
        local_b2 = 0;
        __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (in_stack_fffffffffffff9c0,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         in_stack_fffffffffffff9b0,
                         (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                   (allocator<char> *)in_stack_fffffffffffff9d0);
        std::allocator<char>::~allocator(&local_e1);
        local_e0 = 1;
      }
      else {
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (in_stack_fffffffffffff9c0,
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                           in_stack_fffffffffffff9b0,
                           (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
        uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
        if (bVar2) {
          bVar2 = std::operator==(in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
          if (!bVar2) {
            piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               (local_10,local_38);
            bVar1 = std::ios::operator!(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
            uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
            if ((bVar1 & 1) == 0) {
              bVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x1d1e0d);
              uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
              if (!bVar2) {
                bVar2 = std::
                        regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                  (in_stack_fffffffffffff9c0,
                                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                   in_stack_fffffffffffff9b0,
                                   (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
                if (bVar2) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                             (allocator<char> *)in_stack_fffffffffffff9d0);
                  std::allocator<char>::~allocator(&local_10b);
                  local_e0 = 1;
                }
                else {
                  bVar2 = std::
                          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                    (in_stack_fffffffffffff9c0,
                                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8
                                                ),
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     in_stack_fffffffffffff9b0,
                                     (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
                  if (bVar2) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                               (allocator<char> *)in_stack_fffffffffffff9d0);
                    std::allocator<char>::~allocator(&local_10c);
                    local_e0 = 1;
                  }
                  else {
                    bVar2 = std::
                            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                      (in_stack_fffffffffffff9c0,
                                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        *)CONCAT17(in_stack_fffffffffffff9bf,
                                                   in_stack_fffffffffffff9b8),
                                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       in_stack_fffffffffffff9b0,
                                       (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
                    uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
                    if (!bVar2) {
                      local_472 = 1;
                      uVar7 = __cxa_allocate_exception(0x30);
                      __a = local_471;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,__a);
                      GraphFileError::GraphFileError
                                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                 in_stack_fffffffffffff9f0,(bool)uVar8);
                      local_472 = 0;
                      __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
                    }
                    _Var4 = std::operator|(_S_out,_S_in);
                    std::__cxx11::stringstream::stringstream(local_298,local_38,_Var4);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x1d20ed);
                    std::__cxx11::string::string(in_stack_fffffffffffff9b0);
                    while( true ) {
                      piVar5 = std::operator>>((istream *)local_298,local_2d0);
                      bVar2 = std::ios::operator_cast_to_bool
                                        (piVar5 + *(long *)(*(long *)piVar5 + -0x18));
                      uVar8 = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
                      __val = (uint)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
                      if (!bVar2) break;
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
                    }
                    sVar6 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(&local_2b0);
                    if (sVar6 < 2) {
                      local_2f2 = 1;
                      uVar7 = __cxa_allocate_exception(0x30);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                                 (allocator<char> *)in_stack_fffffffffffff9d0);
                      GraphFileError::GraphFileError
                                (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                 in_stack_fffffffffffff9f0,(bool)uVar8);
                      local_2f2 = 0;
                      __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
                    local_2f8 = std::__cxx11::stoi(in_stack_fffffffffffff9a0,
                                                   in_stack_fffffffffffff998,0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
                    local_2fc = std::__cxx11::stoi(in_stack_fffffffffffff9a0,
                                                   in_stack_fffffffffffff998,0);
                    sVar6 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(&local_2b0);
                    if ((sVar6 == local_2f8 + 1) &&
                       (sVar6 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(&local_2b0), sVar6 != local_2fc * 2 + 2)) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                                 (allocator<char> *)in_stack_fffffffffffff9d0);
                      std::allocator<char>::~allocator(&local_2fd);
                    }
                    else {
                      sVar6 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::size(&local_2b0);
                      if ((sVar6 == local_2f8 + 1) ||
                         (sVar6 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::size(&local_2b0), sVar6 != local_2fc * 2 + 2)) {
                        sVar6 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(&local_2b0);
                        if ((sVar6 == local_2f8 + 1) &&
                           (sVar6 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size(&local_2b0), sVar6 == local_2fc * 2 + 2)) {
                          local_322 = 1;
                          uVar7 = __cxa_allocate_exception(0x30);
                          filename_00 = &local_321;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                                     (allocator<char> *)in_stack_fffffffffffff9d0);
                          GraphFileError::GraphFileError
                                    (in_stack_fffffffffffffa00,filename_00,local_18,
                                     SUB81((ulong)uVar7 >> 0x38,0));
                          local_322 = 0;
                          __cxa_throw(uVar7,&GraphFileError::typeinfo,
                                      GraphFileError::~GraphFileError);
                        }
                        local_449 = 1;
                        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__cxa_allocate_exception(0x30);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&local_2b0);
                        std::__cxx11::to_string((unsigned_long)__lhs);
                        std::operator+((char *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
                        std::operator+(in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0);
                        std::__cxx11::to_string(__val);
                        std::operator+(__lhs,in_stack_fffffffffffff9d0);
                        std::operator+(in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0);
                        std::__cxx11::to_string(__val);
                        std::operator+(__lhs,in_stack_fffffffffffff9d0);
                        std::operator+(in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0);
                        GraphFileError::GraphFileError
                                  (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                   in_stack_fffffffffffff9f0,(bool)uVar8);
                        local_449 = 0;
                        __cxa_throw(__lhs,&GraphFileError::typeinfo,GraphFileError::~GraphFileError)
                        ;
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                                 (allocator<char> *)in_stack_fffffffffffff9d0);
                      std::allocator<char>::~allocator(&local_2fe);
                    }
                    local_e0 = 1;
                    std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff9b0);
                    std::__cxx11::stringstream::~stringstream(local_298);
                  }
                }
                goto LAB_001d2b74;
              }
            }
            local_10a = 1;
            uVar7 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                       (allocator<char> *)in_stack_fffffffffffff9d0);
            GraphFileError::GraphFileError
                      (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0
                       ,(bool)uVar8);
            local_10a = 0;
            __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                     (allocator<char> *)in_stack_fffffffffffff9d0);
          std::allocator<char>::~allocator(&local_e2);
          local_e0 = 1;
        }
        else {
          bVar2 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (in_stack_fffffffffffff9c0,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             in_stack_fffffffffffff9b0,
                             (match_flag_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
          if (!bVar2) {
            uVar7 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                       (allocator<char> *)in_stack_fffffffffffff9d0);
            GraphFileError::GraphFileError
                      (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0
                       ,(bool)uVar8);
            __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                     (allocator<char> *)in_stack_fffffffffffff9d0);
          std::allocator<char>::~allocator(&local_473);
          local_e0 = 1;
        }
      }
LAB_001d2b74:
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x1d2b81);
      std::__cxx11::string::~string(in_stack_fffffffffffff9a0);
      return in_RDI;
    }
  }
  local_6a = 1;
  uVar7 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
             (allocator<char> *)in_stack_fffffffffffff9d0);
  GraphFileError::GraphFileError
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (bool)uVar8);
  local_6a = 0;
  __cxa_throw(uVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto detect_format(ifstream & infile, const string & filename) -> string
{
    string line;
    if (! getline(infile, line) || line.empty())
        throw GraphFileError{filename, "unable to read file to detect file format", true};

    static const regex
        dimacs_comment{R"(c(\s.*)?)"},
        dimacs_problem{R"(p\s+(edge|col)\s+(\d+)\s+(\d+)?\s*)"},
        lad_header{R"(\d+)"},
        lad_zero_labelled_line{R"(0 \d+)"},
        lad_zero_unlabelled_line{R"(0)"},
        lad_line{R"(\d+\s+(\d+\s+)*\d+\s*)"},
        csv_problem{R"(\S+[,>]\S+)"};

    smatch match;
    if (regex_match(line, match, dimacs_comment)) {
        while (regex_match(line, match, dimacs_comment)) {
            // looks like a DIMACS comment, ignore
            if (! getline(infile, line) || line.empty())
                throw GraphFileError{filename, "unable to auto-detect file format (entirely c lines?)", true};
        }
        if (! regex_match(line, match, dimacs_problem))
            throw GraphFileError{filename, "unable to auto-detect file format (c line not followed by a p line?)", true};
        return "dimacs";
    }
    else if (regex_match(line, match, dimacs_problem))
        return "dimacs";
    else if (regex_match(line, match, lad_header)) {
        if ("0" == line)
            return "lad";

        // got to figure out whether we're labelled or not
        if (! getline(infile, line) || line.empty())
            throw GraphFileError{filename, "unable to auto-detect file format (number followed by nothing)", true};
        if (regex_match(line, match, lad_zero_labelled_line))
            return "labelledlad";
        else if (regex_match(line, match, lad_zero_unlabelled_line))
            return "lad";
        else if (regex_match(line, match, lad_line)) {
            stringstream line_stream{line};
            vector<string> words;
            string word;
            while (line_stream >> word)
                words.emplace_back(word);

            if (words.size() < 2)
                throw GraphFileError{filename, "unable to auto-detect file format (not enough words in a lad line)", true};

            unsigned items_if_lad = stoi(words.at(0)), items_if_labelledlad = stoi(words.at(1));
            if (words.size() == items_if_lad + 1 && ! (words.size() == (2 * items_if_labelledlad) + 2))
                return "lad";
            else if (! (words.size() == items_if_lad + 1) && (words.size() == (2 * items_if_labelledlad) + 2))
                return "labelledlad";
            else if ((words.size() == items_if_lad + 1) && (words.size() == (2 * items_if_labelledlad) + 2))
                throw GraphFileError{filename, "unable to auto-detect between lad or labelledlad", true};
            else
                throw GraphFileError{filename, "unable to auto-detect file format (looks like lad, but got " + to_string(words.size()) + " items on a line with first two elements " + to_string(items_if_lad) + " and " + to_string(items_if_labelledlad) + ")", true};
        }
        else
            throw GraphFileError{filename, "unable to auto-detect file format (looks like lad, but no edge line found)", true};
    }
    else if (regex_match(line, match, csv_problem))
        return "csv";

    throw GraphFileError{filename, "unable to auto-detect file format (no recognisable header found)", true};
}